

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

int slurp_central_directory(archive_read *a,_7zip_conflict *zip,_7z_header_info *header)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  archive_read *a_00;
  uint64_t uVar5;
  archive_entry *paVar6;
  int64_t iVar7;
  byte *pbVar8;
  int *piVar9;
  uchar *puVar10;
  ssize_t in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int r;
  int check_header_crc;
  ssize_t bytes_avail;
  uint32_t next_header_crc;
  uint64_t next_header_size;
  uint64_t next_header_offset;
  uchar *p;
  int in_stack_0000007c;
  _7z_folder *in_stack_00000080;
  archive_read *in_stack_00000088;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb0;
  archive_read *in_stack_ffffffffffffffb8;
  uint32_t local_3c;
  int *local_28;
  int local_4;
  
  local_28 = (int *)__archive_read_ahead
                              ((archive_read *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,(ssize_t *)0x1a8437);
  if (local_28 == (int *)0x0) {
    return -0x1e;
  }
  if ((((char)*local_28 == 'M') && (*(char *)((long)local_28 + 1) == 'Z')) ||
     (*local_28 == 0x464c457f)) {
    in_stack_ffffffffffffffb0 = skip_sfx(in_RSI,in_RDX);
    if (in_stack_ffffffffffffffb0 < -0x14) {
      return in_stack_ffffffffffffffb0;
    }
    local_28 = (int *)__archive_read_ahead
                                ((archive_read *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98,(ssize_t *)0x1a84bc);
    if (local_28 == (int *)0x0) {
      return -0x1e;
    }
  }
  in_RSI->skip_file_ino = in_RSI->skip_file_ino + 0x20;
  iVar1 = memcmp(local_28,anon_var_dwarf_35caa,6);
  if (iVar1 == 0) {
    a_00 = (archive_read *)crc32(0,local_28 + 3,0x14);
    uVar2 = archive_le32dec(local_28 + 2);
    if (a_00 == (archive_read *)(ulong)uVar2) {
      uVar5 = archive_le64dec((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
      paVar6 = (archive_entry *)
               archive_le64dec((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                              );
      local_3c = archive_le32dec(local_28 + 7);
      if (paVar6 == (archive_entry *)0x0) {
        local_4 = 1;
      }
      else if ((long)uVar5 < 0) {
        archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
        local_4 = -0x1e;
      }
      else {
        __archive_read_consume
                  ((archive_read *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        if (uVar5 != 0) {
          if ((long)in_stack_ffffffffffffffb8 < (long)uVar5) {
            iVar7 = __archive_read_seek((archive_read *)
                                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),in_stack_ffffffffffffff98,0);
            if (iVar7 < 0) {
              return -0x1e;
            }
          }
          else {
            __archive_read_consume
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                       ,in_stack_ffffffffffffff98);
          }
        }
        (in_RSI->client).position = uVar5;
        in_RSI->skip_file_dev = uVar5;
        in_RSI->entry = paVar6;
        *(undefined8 *)&in_RSI->skip_file_set = 0;
        *(undefined4 *)((long)&(in_RSI->archive).sconv + 4) = 0;
        *(undefined4 *)&(in_RSI->archive).sconv = 1;
        *(undefined4 *)&in_RSI[8].formats[5].read_header = 0;
        iVar1 = 1;
        pbVar8 = header_bytes(in_stack_ffffffffffffffb8,CONCAT44(1,in_stack_ffffffffffffffb0));
        if (pbVar8 == (byte *)0x0) {
          archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
          local_4 = -0x1e;
        }
        else {
          uVar3 = (uint)*pbVar8;
          if (uVar3 != 1) {
            if (uVar3 != 0x17) {
              archive_set_error(in_RDI,-1,"Unexpected Property ID = %X",(ulong)*pbVar8);
              return -0x1e;
            }
            iVar4 = decode_encoded_header_info
                              (a_00,(_7z_stream_info *)
                                    (ulong)CONCAT14(*pbVar8,in_stack_ffffffffffffffa0));
            if ((iVar4 == 0) && (*(ulong *)&in_RSI->skip_file_set != (ulong)local_3c)) {
              archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
              iVar4 = -1;
            }
            if (iVar4 == 0) {
              if ((in_RSI->archive).error[0x48] == '\0') {
                iVar1 = 0;
              }
              else {
                local_3c = *(uint32_t *)((in_RSI->archive).error + 0x4c);
              }
              if (in_RSI->bidders[0].init != (_func_int_archive_read_filter_ptr *)0x0) {
                read_consume((archive_read *)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
              }
              iVar4 = setup_decode_folder(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
              if (iVar4 == 0) {
                in_RSI->entry = (archive_entry *)in_RSI->bidders[0].data;
                iVar4 = seek_pack(a_00);
              }
            }
            free_StreamsInfo((_7z_stream_info *)0x1a8828);
            memset(in_RSI,0,0x68);
            if (iVar4 < 0) {
              return -0x1e;
            }
            *(undefined4 *)((long)&(in_RSI->archive).sconv + 4) = 1;
            *(undefined8 *)&in_RSI->skip_file_set = 0;
          }
          piVar9 = __errno_location();
          *piVar9 = 0;
          iVar4 = read_Header((archive_read *)next_header_offset,(_7z_header_info *)next_header_size
                              ,next_header_crc);
          if (iVar4 < 0) {
            piVar9 = __errno_location();
            if (*piVar9 == 0xc) {
              archive_set_error(in_RDI,-1,"Couldn\'t allocate memory");
            }
            else {
              archive_set_error(in_RDI,-1,"Damaged 7-Zip archive");
            }
            local_4 = -0x1e;
          }
          else {
            puVar10 = header_bytes(in_stack_ffffffffffffffb8,CONCAT44(iVar1,iVar4));
            if ((puVar10 == (uchar *)0x0) || (*puVar10 != '\0')) {
              archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
              local_4 = -0x1e;
            }
            else if ((iVar1 == 0) || (*(ulong *)&in_RSI->skip_file_set == (ulong)local_3c)) {
              *(undefined4 *)((long)&in_RSI->bidders[0].name + 4) = 0;
              *(undefined4 *)&in_RSI->bidders[0].name = 0;
              in_RSI->bidders[0].data = (void *)0x0;
              (in_RSI->client).nodes = 0;
              (in_RSI->client).cursor = 0;
              in_RSI->bidders[0].init = (_func_int_archive_read_filter_ptr *)0x0;
              *(undefined4 *)&(in_RSI->archive).sconv = 0;
              local_4 = 0;
            }
            else {
              archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
              local_4 = -0x1e;
            }
          }
        }
      }
    }
    else {
      archive_set_error(in_RDI,-1,"Header CRC error");
      local_4 = -0x1e;
    }
  }
  else {
    archive_set_error(in_RDI,-1,"Not 7-Zip archive file");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
slurp_central_directory(struct archive_read *a, struct zip *zip)
{
	ssize_t i;
	unsigned found;
	int64_t correction;
	ssize_t bytes_avail;
	const char *p;

	/*
	 * Find the start of the central directory.  The end-of-CD
	 * record has our starting point, but there are lots of
	 * Zip archives which have had other data prepended to the
	 * file, which makes the recorded offsets all too small.
	 * So we search forward from the specified offset until we
	 * find the real start of the central directory.  Then we
	 * know the correction we need to apply to account for leading
	 * padding.
	 */
	if (__archive_read_seek(a, zip->central_directory_offset, SEEK_SET) < 0)
		return ARCHIVE_FATAL;

	found = 0;
	while (!found) {
		if ((p = __archive_read_ahead(a, 20, &bytes_avail)) == NULL)
			return ARCHIVE_FATAL;
		for (found = 0, i = 0; !found && i < bytes_avail - 4;) {
			switch (p[i + 3]) {
			case 'P': i += 3; break;
			case 'K': i += 2; break;
			case 001: i += 1; break;
			case 002:
				if (memcmp(p + i, "PK\001\002", 4) == 0) {
					p += i;
					found = 1;
				} else
					i += 4;
				break;
			case 005: i += 1; break;
			case 006:
				if (memcmp(p + i, "PK\005\006", 4) == 0) {
					p += i;
					found = 1;
				} else if (memcmp(p + i, "PK\006\006", 4) == 0) {
					p += i;
					found = 1;
				} else
					i += 1;
				break;
			default: i += 4; break;
			}
		}
		__archive_read_consume(a, i);
	}
	correction = archive_filter_bytes(&a->archive, 0) - zip->central_directory_offset;

	__archive_rb_tree_init(&zip->tree, &rb_ops);
	__archive_rb_tree_init(&zip->tree_rsrc, &rb_rsrc_ops);

	zip->central_directory_entries_total = 0;
	while (1) {
		struct zip_entry *zip_entry;
		size_t filename_length, extra_length, comment_length;
		uint32_t external_attributes;
		const char *name, *r;

		if ((p = __archive_read_ahead(a, 4, NULL)) == NULL)
			return ARCHIVE_FATAL;
		if (memcmp(p, "PK\006\006", 4) == 0
		    || memcmp(p, "PK\005\006", 4) == 0) {
			break;
		} else if (memcmp(p, "PK\001\002", 4) != 0) {
			archive_set_error(&a->archive,
			    -1, "Invalid central directory signature");
			return ARCHIVE_FATAL;
		}
		if ((p = __archive_read_ahead(a, 46, NULL)) == NULL)
			return ARCHIVE_FATAL;

		zip_entry = calloc(1, sizeof(struct zip_entry));
		zip_entry->next = zip->zip_entries;
		zip_entry->flags |= LA_FROM_CENTRAL_DIRECTORY;
		zip->zip_entries = zip_entry;
		zip->central_directory_entries_total++;

		/* version = p[4]; */
		zip_entry->system = p[5];
		/* version_required = archive_le16dec(p + 6); */
		zip_entry->zip_flags = archive_le16dec(p + 8);
		if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)){
			zip->has_encrypted_entries = 1;
		}
		zip_entry->compression = (char)archive_le16dec(p + 10);
		zip_entry->mtime = zip_time(p + 12);
		zip_entry->crc32 = archive_le32dec(p + 16);
		zip_entry->compressed_size = archive_le32dec(p + 20);
		zip_entry->uncompressed_size = archive_le32dec(p + 24);
		filename_length = archive_le16dec(p + 28);
		extra_length = archive_le16dec(p + 30);
		comment_length = archive_le16dec(p + 32);
		/* disk_start = archive_le16dec(p + 34); */ /* Better be zero. */
		/* internal_attributes = archive_le16dec(p + 36); */ /* text bit */
		external_attributes = archive_le32dec(p + 38);
		zip_entry->local_header_offset =
		    archive_le32dec(p + 42) + correction;

		/* If we can't guess the mode, leave it zero here;
		   when we read the local file header we might get
		   more information. */
		zip_entry->mode = 0;
		if (zip_entry->system == 3) {
			zip_entry->mode = external_attributes >> 16;
		}

		/* We're done with the regular data; get the filename and
		 * extra data. */
		__archive_read_consume(a, 46);
		if ((p = __archive_read_ahead(a, filename_length + extra_length, NULL))
		    == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file header");
			return ARCHIVE_FATAL;
		}
		process_extra(p + filename_length, extra_length, zip_entry);

		/*
		 * Mac resource fork files are stored under the
		 * "__MACOSX/" directory, so we should check if
		 * it is.
		 */
		if (!zip->process_mac_extensions) {
			/* Treat every entry as a regular entry. */
			__archive_rb_tree_insert_node(&zip->tree,
			    &zip_entry->node);
		} else {
			name = p;
			r = rsrc_basename(name, filename_length);
			if (filename_length >= 9 &&
			    strncmp("__MACOSX/", name, 9) == 0) {
				/* If this file is not a resource fork nor
				 * a directory. We should treat it as a non
				 * resource fork file to expose it. */
				if (name[filename_length-1] != '/' &&
				    (r - name < 3 || r[0] != '.' || r[1] != '_')) {
					__archive_rb_tree_insert_node(&zip->tree,
					    &zip_entry->node);
					/* Expose its parent directories. */
					expose_parent_dirs(zip, name, filename_length);
				} else {
					/* This file is a resource fork file or
					 * a directory. */
					archive_strncpy(&(zip_entry->rsrcname), name,
					    filename_length);
					__archive_rb_tree_insert_node(&zip->tree_rsrc,
					    &zip_entry->node);
				}
			} else {
				/* Generate resource fork name to find its resource
				 * file at zip->tree_rsrc. */
				archive_strcpy(&(zip_entry->rsrcname), "__MACOSX/");
				archive_strncat(&(zip_entry->rsrcname), name, r - name);
				archive_strcat(&(zip_entry->rsrcname), "._");
				archive_strncat(&(zip_entry->rsrcname),
				    name + (r - name), filename_length - (r - name));
				/* Register an entry to RB tree to sort it by
				 * file offset. */
				__archive_rb_tree_insert_node(&zip->tree,
				    &zip_entry->node);
			}
		}

		/* Skip the comment too ... */
		__archive_read_consume(a,
		    filename_length + extra_length + comment_length);
	}

	return ARCHIVE_OK;
}